

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

void __thiscall
mjs::string_object::add_own_property_names
          (string_object *this,vector<mjs::string,_std::allocator<mjs::string>_> *names,
          bool check_enumerable)

{
  gc_heap *h_00;
  size_type sVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  wstring_view wVar3;
  wstring local_80;
  wstring_view local_60;
  string local_50;
  uint local_40;
  uint local_3c;
  uint32_t l;
  uint i;
  gc_heap *h;
  wstring_view s;
  bool check_enumerable_local;
  vector<mjs::string,_std::allocator<mjs::string>_> *names_local;
  string_object *this_local;
  
  s._M_str._7_1_ = check_enumerable;
  if ((this->is_v5_or_later_ & 1U) != 0) {
    _h = view(this);
    _l = object::heap((object *)this);
    local_3c = 0;
    sVar1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                      ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&h);
    local_40 = (uint)sVar1;
    uVar2 = extraout_RDX;
    for (; h_00 = _l, local_3c < local_40; local_3c = local_3c + 1) {
      index_string_abi_cxx11_(&local_80,(mjs *)(ulong)local_3c,(uint32_t)uVar2);
      wVar3 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_80);
      local_60 = wVar3;
      string::string(&local_50,h_00,&local_60);
      std::vector<mjs::string,_std::allocator<mjs::string>_>::push_back(names,&local_50);
      string::~string(&local_50);
      std::__cxx11::wstring::~wstring((wstring *)&local_80);
      uVar2 = extraout_RDX_00;
    }
  }
  native_object::add_own_property_names(&this->super_native_object,names,(bool)(s._M_str._7_1_ & 1))
  ;
  return;
}

Assistant:

void add_own_property_names(std::vector<string>& names, bool check_enumerable) const override {
        if (is_v5_or_later_) {
            const auto s = view();
            auto& h = heap();
            for (auto i = 0U, l = static_cast<uint32_t>(s.length()); i < l; ++i) {
                names.push_back(string{h, index_string(i)});
            }
        }
        native_object::add_own_property_names(names, check_enumerable);
    }